

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatc_compat.c
# Opt level: O1

int main(int argc,char **argv)

{
  void *buf;
  ulong uVar1;
  char cVar2;
  int iVar3;
  FILE *pFVar4;
  ulong __n;
  size_t sVar5;
  ulong uVar6;
  undefined4 in_register_0000003c;
  flatcc_table_verifier_descriptor_t *td;
  ulong uVar7;
  uchar *pc;
  void *__ptr;
  void *p;
  undefined8 local_48;
  
  td = (flatcc_table_verifier_descriptor_t *)CONCAT44(in_register_0000003c,argc);
  if (argc - 3U < 0xfffffffe) {
    main_cold_4();
    iVar3 = flatcc_verify_field(td,0,0x20,0x10);
    if (((((((((iVar3 == 0) && (iVar3 = flatcc_verify_field(td,1,2,2), iVar3 == 0)) &&
             (iVar3 = flatcc_verify_field(td,2,2,2), iVar3 == 0)) &&
            (((iVar3 = flatcc_verify_string_field(td,3,1), iVar3 == 0 &&
              (iVar3 = flatcc_verify_vector_field(td,5,0,1,1,0xffffffff), iVar3 == 0)) &&
             ((iVar3 = flatcc_verify_field(td,6,1,1), iVar3 == 0 &&
              ((iVar3 = flatcc_verify_union_field(td,8,0,MyGame_Example_Any_union_verifier),
               iVar3 == 0 && (iVar3 = flatcc_verify_vector_field(td,9,0,4,2,0x3fffffff), iVar3 == 0)
               ))))))) && (iVar3 = flatcc_verify_string_vector_field(td,10,0), iVar3 == 0)) &&
          (((((iVar3 = flatcc_verify_table_vector_field
                                 (td,0xb,0,MyGame_Example_Monster_verify_table), iVar3 == 0 &&
              (iVar3 = flatcc_verify_table_field(td,0xc,0,MyGame_Example_Monster_verify_table),
              iVar3 == 0)) &&
             (iVar3 = flatcc_verify_table_as_nested_root
                                (td,0xd,0,(char *)0x0,1,MyGame_Example_Monster_verify_table),
             iVar3 == 0)) &&
            ((iVar3 = flatcc_verify_table_field(td,0xe,0,MyGame_Example_Stat_verify_table),
             iVar3 == 0 && (iVar3 = flatcc_verify_field(td,0xf,1,1), iVar3 == 0)))) &&
           (iVar3 = flatcc_verify_field(td,0x10,4,4), iVar3 == 0)))) &&
         (((iVar3 = flatcc_verify_field(td,0x11,4,4), iVar3 == 0 &&
           (iVar3 = flatcc_verify_field(td,0x12,8,8), iVar3 == 0)) &&
          (((iVar3 = flatcc_verify_field(td,0x13,8,8), iVar3 == 0 &&
            (((iVar3 = flatcc_verify_field(td,0x14,4,4), iVar3 == 0 &&
              (iVar3 = flatcc_verify_field(td,0x15,4,4), iVar3 == 0)) &&
             (iVar3 = flatcc_verify_field(td,0x16,8,8), iVar3 == 0)))) &&
           (((iVar3 = flatcc_verify_field(td,0x17,8,8), iVar3 == 0 &&
             (iVar3 = flatcc_verify_vector_field(td,0x18,0,1,1,0xffffffff), iVar3 == 0)) &&
            (iVar3 = flatcc_verify_field(td,0x19,4,4), iVar3 == 0)))))))) &&
        (((iVar3 = flatcc_verify_field(td,0x1a,4,4), iVar3 == 0 &&
          (iVar3 = flatcc_verify_field(td,0x1b,4,4), iVar3 == 0)) &&
         ((iVar3 = flatcc_verify_string_vector_field(td,0x1c,0), iVar3 == 0 &&
          (((iVar3 = flatcc_verify_vector_field(td,0x1d,0,8,4,0x1fffffff), iVar3 == 0 &&
            (iVar3 = flatcc_verify_vector_field(td,0x1e,0,1,1,0xffffffff), iVar3 == 0)) &&
           (iVar3 = flatcc_verify_vector_field(td,0x1f,0,4,2,0x3fffffff), iVar3 == 0)))))))) &&
       (((iVar3 = flatcc_verify_vector_field(td,0x20,0,8,8,0x1fffffff), iVar3 == 0 &&
         (iVar3 = flatcc_verify_vector_field(td,0x21,0,8,8,0x1fffffff), iVar3 == 0)) &&
        (iVar3 = flatcc_verify_table_field(td,0x22,0,MyGame_InParentNamespace_verify_table),
        iVar3 == 0)))) {
      iVar3 = flatcc_verify_table_field(td,0x23,0,MyGame_Example_TestBase64_verify_table);
      return iVar3;
    }
    return iVar3;
  }
  if (argc == 2) {
    filename = argv[1];
  }
  pFVar4 = fopen(filename,"rb");
  __ptr = (void *)0x0;
  uVar7 = 0;
  if (pFVar4 == (FILE *)0x0) {
LAB_00102a66:
    __n = uVar7;
    if (pFVar4 != (FILE *)0x0) {
      fclose(pFVar4);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    __ptr = (void *)0x0;
  }
  else {
    fseek(pFVar4,0,2);
    __n = ftell(pFVar4);
    __ptr = (void *)0x0;
    uVar7 = 0;
    if ((long)__n < 0) goto LAB_00102a66;
    uVar7 = __n;
    if (0x400 < __n) {
LAB_00102a60:
      __ptr = (void *)0x0;
      goto LAB_00102a66;
    }
    rewind(pFVar4);
    __ptr = malloc(__n + (__n == 0));
    if (__ptr == (void *)0x0) goto LAB_00102a60;
    uVar1 = 0;
    do {
      uVar6 = uVar1;
      sVar5 = fread((void *)((long)__ptr + uVar6),1,__n - uVar6,pFVar4);
      uVar1 = sVar5 + uVar6;
    } while (sVar5 != 0);
    if (__n != uVar6) goto LAB_00102a66;
    fclose(pFVar4);
  }
  local_48 = (void *)0x0;
  iVar3 = posix_memalign((void **)&local_48,0x100,__n + 0xff & 0xffffffffffffff00);
  if (local_48 != (void *)0x0 && iVar3 != 0) {
    free(local_48);
    local_48 = (void *)0x0;
  }
  buf = local_48;
  memcpy(local_48,__ptr,__n);
  free(__ptr);
  pFVar4 = _stderr;
  if (buf == (void *)0x0) {
    fprintf(_stderr,"could not read binary test file: %s\n",filename);
    return -1;
  }
  uVar7 = 0;
  fprintf(_stderr,"%s:\n","monsterdata_test.mon");
  if ((__n & 0xffffffff) != 0) {
    uVar7 = 0;
    do {
      if ((uVar7 & 0xf) == 0) {
        if (uVar7 != 0) {
          fprintf(pFVar4,"  |%s|\n",&local_48);
        }
        fprintf(pFVar4,"%08x ",uVar7 & 0xffffffff);
      }
      else if ((uVar7 & 7) == 0) {
        fputc(0x20,pFVar4);
      }
      fprintf(pFVar4," %02x",(ulong)*(byte *)((long)buf + uVar7));
      cVar2 = *(char *)((long)buf + uVar7);
      if ((byte)(*(char *)((long)buf + uVar7) + 0x81U) < 0xa1) {
        cVar2 = '.';
      }
      *(char *)((long)&local_48 + (ulong)((uint)uVar7 & 0xf)) = cVar2;
      *(undefined1 *)((long)&local_48 + (uVar7 & 0xf) + 1) = 0;
      uVar7 = uVar7 + 1;
    } while ((__n & 0xffffffff) != uVar7);
  }
  if (0xfffffff7 < ((uint)uVar7 & 0xf) - 9) {
    fputc(0x20,pFVar4);
  }
  if ((uVar7 & 0xf) != 0) {
    main_cold_1();
  }
  fprintf(pFVar4,"  |%s|\n",&local_48);
  iVar3 = flatcc_verify_table_as_root(buf,__n,"MONS",MyGame_Example_Monster_verify_table);
  if (iVar3 == 0) {
    iVar3 = flatcc_verify_table_as_root(buf,__n,"MONS",MyGame_Example_Monster_verify_table);
    if (iVar3 == 0) {
      iVar3 = verify_monster(buf);
      goto LAB_00102c5b;
    }
    main_cold_3();
  }
  else {
    main_cold_2();
  }
  iVar3 = -1;
LAB_00102c5b:
  free(buf);
  return iVar3;
}

Assistant:

int main(int argc, char *argv[])
{
    int ret;
    size_t size;
    void *buffer, *raw_buffer;

    if (argc != 1 && argc != 2) {
        fprintf(stderr, usage);
        exit(1);
    }
    if (argc == 2) {
        filename = argv[1];
    }

    raw_buffer = readfile(filename, 1024, &size);
    buffer = aligned_alloc(256, align_up(256, size));
    memcpy(buffer, raw_buffer, size);
    free(raw_buffer);

    if (!buffer) {
        fprintf(stderr, "could not read binary test file: %s\n", filename);
        return -1;
    }
    hexdump("monsterdata_test.mon", buffer, size, stderr);
    /*
     * Not automated, but verifying size - 3 fails as expected because the last
     * object in the file is a string, and the zero termination fails.
     * size - 1 and size - 2 verifies because the buffers contains
     * padding. Note that `flatcc` does not pad at the end beyond whatever
     * is stored (normally a vtable), but this is generated with `flatc
     * v1.1`.
     */
    if (flatcc_verify_ok != ns(Monster_verify_as_root_with_identifier(buffer, size, "MONS"))) {
#if FLATBUFFERS_PROTOCOL_IS_BE
        fprintf(stderr, "flatc golden reference buffer was correctly rejected by flatcc verificiation\n"
                "because flatc is little endian and flatcc has been compiled for big endian protocol format\n");
        ret = 0;
        goto done;
#else
        fprintf(stderr, "could not verify foreign monster file\n");
        ret = -1;
        goto done;
#endif
    }

#if FLATBUFFERS_PROTOCOL_IS_BE
    fprintf(stderr, "flatcc compiled with big endian protocol failed to reject reference little endian buffer\n");
    ret = -1;
    goto done;
#else
    if (flatcc_verify_ok != ns(Monster_verify_as_root(buffer, size))) {
        fprintf(stderr, "could not verify foreign monster file with default identifier\n");
        ret = -1;
        goto done;
    }
    ret = verify_monster(buffer);
#endif

done:
    aligned_free(buffer);
    return ret;
}